

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall Chainstate::InitCoinsCache(Chainstate *this,size_t cache_size_bytes)

{
  long lVar1;
  CoinsViews *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_coins_views)._M_t.
            super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
            super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
            super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  if (this_00 == (CoinsViews *)0x0) {
    __assert_fail("m_coins_views != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x7bc,"void Chainstate::InitCoinsCache(size_t)");
  }
  this->m_coinstip_cache_size_bytes = cache_size_bytes;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CoinsViews::InitCache(this_00);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InitCoinsCache(size_t cache_size_bytes)
{
    AssertLockHeld(::cs_main);
    assert(m_coins_views != nullptr);
    m_coinstip_cache_size_bytes = cache_size_bytes;
    m_coins_views->InitCache();
}